

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O3

void Macro_smpsFade(uint arg_count,long *arg_array)

{
  uchar byte;
  
  if (target_driver < 3) {
    byte = 0xe4;
    if (((arg_count == 0) || (source_driver < 3)) || (*arg_array == 0xff)) goto LAB_0010426f;
  }
  else {
    MemoryStream_WriteByte(output_stream,0xe2);
    if (arg_count != 0) {
      MemoryStream_WriteByte(output_stream,(uchar)*arg_array);
    }
    byte = 0xf2;
    if (source_driver < 3) {
LAB_0010426f:
      MemoryStream_WriteByte(output_stream,byte);
      return;
    }
  }
  return;
}

Assistant:

static void Macro_smpsFade(unsigned int arg_count, long arg_array[])
{
	if (target_driver >= 3)
	{
		WriteByte(0xE2);

		if (arg_count >= 1)
			WriteByte(arg_array[0]);

		if (source_driver < 3)
			Macro_smpsStop(arg_count, arg_array);
	}
	else if (source_driver >= 3 && arg_count >= 1 && arg_array[0] != 0xFF)
	{
		// We should ignore these (they're actually smpsNop commands)
	}
	else
	{
		WriteByte(0xE4);
	}
}